

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_0::StoringUndef::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *param_3)

{
  Op OVar1;
  uint32_t uVar2;
  DefUseManager *this_00;
  Instruction *this_01;
  Instruction *object_inst;
  uint32_t object_id;
  DefUseManager *def_use_mgr;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *param_3_local;
  Instruction *inst_local;
  IRContext *context_local;
  anon_class_1_0_00000001 *this_local;
  
  OVar1 = Instruction::opcode(inst);
  if (OVar1 == OpStore) {
    this_00 = IRContext::get_def_use_mgr(context);
    uVar2 = Instruction::NumInOperands(inst);
    if ((uVar2 == 3) && (uVar2 = Instruction::GetSingleWordInOperand(inst,2), (uVar2 & 1) != 0)) {
      this_local._7_1_ = false;
    }
    else {
      uVar2 = Instruction::GetSingleWordInOperand(inst,1);
      this_01 = analysis::DefUseManager::GetDef(this_00,uVar2);
      OVar1 = Instruction::opcode(this_01);
      if (OVar1 == OpUndef) {
        Instruction::ToNop(inst);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    return this_local._7_1_;
  }
  __assert_fail("inst->opcode() == spv::Op::OpStore && \"Wrong opcode.  Should be OpStore.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                ,0xa3a,
                "auto spvtools::opt::(anonymous namespace)::StoringUndef()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
               );
}

Assistant:

FoldingRule StoringUndef() {
  return [](IRContext* context, Instruction* inst,
            const std::vector<const analysis::Constant*>&) {
    assert(inst->opcode() == spv::Op::OpStore &&
           "Wrong opcode.  Should be OpStore.");

    analysis::DefUseManager* def_use_mgr = context->get_def_use_mgr();

    // If this is a volatile store, the store cannot be removed.
    if (inst->NumInOperands() == 3) {
      if (inst->GetSingleWordInOperand(2) &
          uint32_t(spv::MemoryAccessMask::Volatile)) {
        return false;
      }
    }

    uint32_t object_id = inst->GetSingleWordInOperand(kStoreObjectInIdx);
    Instruction* object_inst = def_use_mgr->GetDef(object_id);
    if (object_inst->opcode() == spv::Op::OpUndef) {
      inst->ToNop();
      return true;
    }
    return false;
  };
}